

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Check_Browser.cxx
# Opt level: O0

void __thiscall Fl_Check_Browser::checked(Fl_Check_Browser *this,int i,int b)

{
  cb_item *pcVar1;
  cb_item *p;
  int b_local;
  int i_local;
  Fl_Check_Browser *this_local;
  
  pcVar1 = find_item(this,i);
  if ((pcVar1 != (cb_item *)0x0) && (pcVar1->checked != b)) {
    pcVar1->checked = (char)b;
    if (b == 0) {
      this->nchecked_ = this->nchecked_ + -1;
    }
    else {
      this->nchecked_ = this->nchecked_ + 1;
    }
    Fl_Widget::redraw((Fl_Widget *)this);
  }
  return;
}

Assistant:

void Fl_Check_Browser::checked(int i, int b) {
	cb_item *p = find_item(i);

	if (p && (p->checked ^ b)) {
		p->checked = b;
		if (b) {
			nchecked_++;
		} else {
			nchecked_--;
		}
		redraw();
	}
}